

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

STRING_HANDLE STRING_new_JSON(char *source)

{
  char *pcVar1;
  byte bVar2;
  size_t sVar3;
  STRING_HANDLE __ptr;
  char *pcVar4;
  LOGGER_LOG p_Var5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (source == (char *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar4 = "invalid arg (NULL)";
      iVar6 = 0x108;
LAB_00110895:
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                ,"STRING_new_JSON",iVar6,1,pcVar4);
      return (STRING_HANDLE)0x0;
    }
  }
  else {
    sVar3 = strlen(source);
    if (sVar3 == 0) {
      uVar10 = 0;
      uVar9 = 0;
    }
    else {
      sVar7 = 0;
      uVar8 = 0;
      uVar10 = 0;
      do {
        bVar2 = source[sVar7];
        if ((char)bVar2 < '\0') {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 == (LOGGER_LOG)0x0) {
            return (STRING_HANDLE)0x0;
          }
          pcVar4 = "invalid character in input string";
          iVar6 = 300;
          goto LAB_00110895;
        }
        if (bVar2 < 0x20) {
          uVar8 = uVar8 + 1;
        }
        else if ((bVar2 - 0x22 < 0x3b) &&
                ((0x400000000002001U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) != 0)) {
          uVar10 = uVar10 + 1;
        }
        sVar7 = sVar7 + 1;
      } while (sVar3 != sVar7);
      uVar9 = 0xffffffffffffffff;
      if (uVar8 < 0x3333333333333334) {
        uVar9 = uVar8 * 5;
      }
    }
    uVar8 = uVar9 + sVar3;
    if (CARRY8(uVar9,sVar3)) {
      uVar8 = 0xffffffffffffffff;
    }
    uVar9 = uVar8 + uVar10;
    if (CARRY8(uVar8,uVar10)) {
      uVar9 = 0xffffffffffffffff;
    }
    uVar10 = uVar9 + 3;
    if (0xfffffffffffffffc < uVar9) {
      uVar10 = 0xffffffffffffffff;
    }
    if (uVar10 == 0xffffffffffffffff) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        pcVar4 = "malloc len overflow";
        iVar6 = 0x139;
        goto LAB_00110895;
      }
    }
    else {
      __ptr = (STRING_HANDLE)malloc(8);
      if (__ptr == (STRING_HANDLE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          pcVar4 = "malloc json failure";
          iVar6 = 0x13e;
          goto LAB_00110895;
        }
      }
      else {
        pcVar4 = (char *)malloc(uVar10);
        __ptr->s = pcVar4;
        if (pcVar4 == (char *)0x0) {
          free(__ptr);
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar4 = "malloc failed";
            iVar6 = 0x145;
            goto LAB_00110895;
          }
        }
        else {
          *pcVar4 = '\"';
          if (sVar3 == 0) {
            uVar9 = 1;
          }
          else {
            sVar7 = 0;
            uVar8 = 1;
            do {
              bVar2 = source[sVar7];
              if (((char)bVar2 < ' ') && (uVar9 = uVar8 + 6, uVar9 <= uVar10)) {
                pcVar1 = pcVar4 + uVar8;
                pcVar1[0] = '\\';
                pcVar1[1] = 'u';
                pcVar1[2] = '0';
                pcVar1[3] = '0';
                pcVar4[uVar8 + 4] = "0123456789ABCDEF"[bVar2 >> 4];
                pcVar4[uVar8 + 5] = "0123456789ABCDEF"[bVar2 & 0xf];
              }
              else {
                uVar9 = uVar8 + 2;
                if ((bVar2 == 0x22) && (uVar9 <= uVar10)) {
                  (pcVar4 + uVar8)[0] = '\\';
                  (pcVar4 + uVar8)[1] = '\"';
                }
                else if ((bVar2 == 0x5c) && (uVar9 <= uVar10)) {
                  (pcVar4 + uVar8)[0] = '\\';
                  (pcVar4 + uVar8)[1] = '\\';
                }
                else if ((bVar2 == 0x2f) && (uVar9 <= uVar10)) {
                  (pcVar4 + uVar8)[0] = '\\';
                  (pcVar4 + uVar8)[1] = '/';
                }
                else {
                  pcVar4[uVar8] = bVar2;
                  uVar9 = uVar8 + 1;
                }
              }
              sVar7 = sVar7 + 1;
              uVar8 = uVar9;
            } while (sVar3 != sVar7);
          }
          if (uVar9 + 1 < uVar10) {
            pcVar4 = __ptr->s + uVar9;
            pcVar4[0] = '\"';
            pcVar4[1] = '\0';
            return __ptr;
          }
          free(__ptr->s);
          free(__ptr);
        }
      }
    }
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE STRING_new_JSON(const char* source)
{
    STRING* result;
    if (source == NULL)
    {
        /*Codes_SRS_STRING_02_011: [If source is NULL then STRING_new_JSON shall return NULL.] */
        result = NULL;
        LogError("invalid arg (NULL)");
    }
    else
    {
        size_t i;
        size_t nControlCharacters = 0; /*counts how many characters are to be expanded from 1 character to \uxxxx (6 characters)*/
        size_t nEscapeCharacters = 0;
        size_t vlen = strlen(source);

        for (i = 0; i < vlen; i++)
        {
            /*Codes_SRS_STRING_02_014: [If any character has the value outside [1...127] then STRING_new_JSON shall fail and return NULL.] */
            if ((unsigned char)source[i] >= 128) /*this be a UNICODE character begin*/
            {
                break;
            }
            else
            {
                if (source[i] <= 0x1F)
                {
                    nControlCharacters++;
                }
                else if (
                    (source[i] == '"') ||
                    (source[i] == '\\') ||
                    (source[i] == '/')
                    )
                {
                    nEscapeCharacters++;
                }
            }
        }

        if (i < vlen)
        {
            result = NULL;
            LogError("invalid character in input string");
        }
        else
        {
            //size_t malloc_len = vlen + 5 * nControlCharacters + nEscapeCharacters + 3;
            size_t malloc_len = safe_multiply_size_t(5, nControlCharacters);
            malloc_len = safe_add_size_t(malloc_len, vlen);
            malloc_len = safe_add_size_t(malloc_len, nEscapeCharacters);
            malloc_len = safe_add_size_t(malloc_len, 3);

            if (malloc_len == SIZE_MAX)
            {
                result = NULL;
                LogError("malloc len overflow");
            }
            else if ((result = (STRING*)malloc(sizeof(STRING))) == NULL)
            {
                /*Codes_SRS_STRING_02_021: [If the complete JSON representation cannot be produced, then STRING_new_JSON shall fail and return NULL.] */
                LogError("malloc json failure");
            }
            else if ((result->s = (char*)malloc(malloc_len)) == NULL)
            {
                /*Codes_SRS_STRING_02_021: [If the complete JSON representation cannot be produced, then STRING_new_JSON shall fail and return NULL.] */
                free(result);
                result = NULL;
                LogError("malloc failed");
            }
            else
            {
                size_t pos = 0;
                /*Codes_SRS_STRING_02_012: [The string shall begin with the quote character.] */
                result->s[pos++] = '"';
                for (i = 0; i < vlen; i++)
                {
                    if ((source[i] <= 0x1F) && ((pos + 6) <= malloc_len))
                    {
                        /*Codes_SRS_STRING_02_019: [If the character code is less than 0x20 then it shall be represented as \u00xx, where xx is the hex representation of the character code.]*/
                        result->s[pos++] = '\\';
                        result->s[pos++] = 'u';
                        result->s[pos++] = '0';
                        result->s[pos++] = '0';
                        result->s[pos++] = hexToASCII[(source[i] & 0xF0) >> 4]; /*high nibble*/
                        result->s[pos++] = hexToASCII[source[i] & 0x0F]; /*low nibble*/
                    }
                    else if ((source[i] == '"') && ((pos + 2) <= malloc_len))
                    {
                        /*Codes_SRS_STRING_02_016: [If the character is " (quote) then it shall be repsented as \".] */
                        result->s[pos++] = '\\';
                        result->s[pos++] = '"';
                    }
                    else if ((source[i] == '\\') && ((pos + 2) <= malloc_len))
                    {
                        /*Codes_SRS_STRING_02_017: [If the character is \ (backslash) then it shall represented as \\.] */
                        result->s[pos++] = '\\';
                        result->s[pos++] = '\\';
                    }
                    else if ((source[i] == '/') && ((pos + 2) <= malloc_len))
                    {
                        /*Codes_SRS_STRING_02_018: [If the character is / (slash) then it shall be represented as \/.] */
                        result->s[pos++] = '\\';
                        result->s[pos++] = '/';
                    }
                    else if (pos < malloc_len)
                    {
                        /*Codes_SRS_STRING_02_013: [The string shall copy the characters of source "as they are" (until the '\0' character) with the following exceptions:] */
                        result->s[pos++] = source[i];
                    }
                    else
                    {
                        free(result->s);
                        free(result);
                        result = NULL;
                        break;
                    }
                }

                if ((pos + 1) < malloc_len)
                {
                    /*Codes_SRS_STRING_02_020: [The string shall end with " (quote).] */
                    result->s[pos++] = '"';
                    /*zero terminating it*/
                    result->s[pos] = '\0';
                }
                else
                {
                    free(result->s);
                    free(result);
                    result = NULL;
                }
            }
        }

    }
    return (STRING_HANDLE)result;
}